

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O3

BOOL GetFileSizeEx(HANDLE hFile,PLARGE_INTEGER lpFileSize)

{
  PAL_ERROR PVar1;
  BOOL BVar2;
  undefined8 in_RAX;
  CPalThread *pThread;
  PAL_ERROR *pPVar3;
  undefined8 local_38;
  DWORD dwFileSizeHigh;
  DWORD dwFileSizeLow;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_002bf434;
  local_38 = in_RAX;
  pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
  if (pThread == (CPalThread *)0x0) {
    pThread = CreateCurrentThreadData();
  }
  if (lpFileSize == (PLARGE_INTEGER)0x0) {
    PVar1 = 0x57;
LAB_002bf414:
    pPVar3 = (PAL_ERROR *)__errno_location();
    *pPVar3 = PVar1;
    BVar2 = 0;
  }
  else {
    PVar1 = CorUnix::InternalGetFileSize
                      (pThread,hFile,(DWORD *)((long)&local_38 + 4),(DWORD *)&local_38);
    (lpFileSize->field_0).LowPart = local_38._4_4_;
    (lpFileSize->field_0).HighPart = (DWORD)local_38;
    if (PVar1 != 0) goto LAB_002bf414;
    BVar2 = 1;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return BVar2;
  }
LAB_002bf434:
  abort();
}

Assistant:

BOOL
PALAPI GetFileSizeEx(
IN   HANDLE hFile,
OUT  PLARGE_INTEGER lpFileSize)
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pThread;
    DWORD dwFileSizeHigh;
    DWORD dwFileSizeLow;

    PERF_ENTRY(GetFileSizeEx);
    ENTRY("GetFileSizeEx(hFile=%p, lpFileSize=%p)\n", hFile, lpFileSize);

    pThread = InternalGetCurrentThread();

    if (lpFileSize != NULL)
    {
        palError = InternalGetFileSize(
            pThread,
            hFile,
            &dwFileSizeLow,
            &dwFileSizeHigh
            );

        lpFileSize->u.LowPart = dwFileSizeLow;
        lpFileSize->u.HighPart = dwFileSizeHigh;
    }
    else
    {
        palError = ERROR_INVALID_PARAMETER;
    }

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
    }

    LOGEXIT("GetFileSizeEx returns BOOL %d\n", NO_ERROR == palError);
    PERF_EXIT(GetFileSizeEx);
    return NO_ERROR == palError;
}